

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

slab * slab_get(slab_cache *cache,size_t size)

{
  size_t sVar1;
  byte order;
  slab *psVar2;
  size_t sVar3;
  
  order = slab_order(cache,size + 0x30);
  if (cache->order_max + 1 == (uint)order) {
    psVar2 = slab_get_large(cache,size);
  }
  else {
    psVar2 = slab_get_with_order(cache,order);
  }
  if (psVar2 != (slab *)0x0) {
    sVar1 = psVar2->size;
    sVar3 = slab_real_size(cache,size);
    if (sVar1 != sVar3) {
      __assert_fail("slab == NULL || slab->size == slab_real_size(cache, size)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x145,"struct slab *slab_get(struct slab_cache *, size_t)");
    }
  }
  return psVar2;
}

Assistant:

struct slab *
slab_get(struct slab_cache *cache, size_t size)
{
	struct slab *slab;
	uint8_t order = slab_order(cache, size + slab_sizeof());
	if (order == cache->order_max + 1)
		slab = slab_get_large(cache, size);
	else
		slab = slab_get_with_order(cache, order);
	assert(slab == NULL || slab->size == slab_real_size(cache, size));
	return slab;
}